

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::session_impl::dht_put_immutable_item
          (session_impl *this,entry *data,sha1_hash target)

{
  dht_tracker *this_00;
  function<void_(int)> local_60;
  _Bind<void_(*(std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>))(libtorrent::aux::alert_manager_&,_libtorrent::digest32<160L>,_int)>
  local_40;
  
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 != (dht_tracker *)0x0) {
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Head_base<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_false>.
    _M_head_impl._M_data = (reference_wrapper<libtorrent::aux::alert_manager>)&this->m_alerts;
    local_40._M_f = anon_unknown_119::on_dht_put_immutable_item;
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems[0] =
         target.m_number._M_elems[0];
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems[1] =
         target.m_number._M_elems[1];
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems[2] =
         target.m_number._M_elems[2];
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems[3] =
         target.m_number._M_elems[3];
    local_40._M_bound_args.
    super__Tuple_impl<0UL,_std::reference_wrapper<libtorrent::aux::alert_manager>,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>
    .super__Tuple_impl<1UL,_libtorrent::digest32<160L>,_std::_Placeholder<1>_>.
    super__Head_base<1UL,_libtorrent::digest32<160L>,_false>._M_head_impl.m_number._M_elems[4] =
         target.m_number._M_elems[4];
    ::std::function<void(int)>::
    function<std::_Bind<void(*(std::reference_wrapper<libtorrent::aux::alert_manager>,libtorrent::digest32<160l>,std::_Placeholder<1>))(libtorrent::aux::alert_manager&,libtorrent::digest32<160l>,int)>,void>
              ((function<void(int)> *)&local_60,&local_40);
    libtorrent::dht::dht_tracker::put_item(this_00,data,&local_60);
    ::std::_Function_base::~_Function_base(&local_60.super__Function_base);
  }
  return;
}

Assistant:

ip_filter const& session_impl::get_peer_class_filter() const
	{
		return m_peer_class_filter;
	}